

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.hpp
# Opt level: O3

size_t __thiscall Diligent::RenderPassCache::RenderPassCacheKey::GetHash(RenderPassCacheKey *this)

{
  uint uVar1;
  ulong uVar2;
  size_t Seed;
  size_t local_18;
  
  if (this->Hash != 0) {
    return this->Hash;
  }
  local_18 = 0;
  HashCombine<unsigned_char,unsigned_char,Diligent::TEXTURE_FORMAT,bool,bool>
            (&local_18,&this->NumRenderTargets,&this->SampleCount,&this->DSVFormat,&this->EnableVRS,
             &this->ReadOnlyDSV);
  this->Hash = local_18;
  if ((ulong)this->NumRenderTargets != 0) {
    uVar2 = 0;
    do {
      uVar1 = (uint)this->RTVFormats[uVar2] * 0x1001;
      uVar1 = (uVar1 >> 0x16 ^ uVar1) * 0x11;
      uVar1 = (uVar1 >> 9 ^ uVar1) * 0x401;
      local_18 = local_18 ^
                 (local_18 >> 2) + local_18 * 0x40 + 0x9e3779b9 +
                 (ulong)((uVar1 >> 2 ^ uVar1) * 0x81081);
      this->Hash = local_18;
      uVar2 = uVar2 + 1;
    } while (this->NumRenderTargets != uVar2);
  }
  return local_18;
}

Assistant:

size_t GetHash() const noexcept
        {
            if (Hash == 0)
            {
                Hash = ComputeHash(NumRenderTargets, SampleCount, DSVFormat, EnableVRS, ReadOnlyDSV);
                for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
                    HashCombine(Hash, RTVFormats[rt]);
            }
            return Hash;
        }